

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

int __thiscall
glcts::TextureCubeMapArraySamplingTest::programDefinition::init
          (programDefinition *this,EVP_PKEY_CTX *ctx)

{
  shaderDefinition *psVar1;
  GLuint GVar2;
  deUint32 err;
  shaderDefinition *in_RAX;
  shaderDefinition *psVar3;
  shaderDefinition *extraout_RAX;
  InternalError *this_00;
  undefined4 in_ECX;
  shaderDefinition *psVar4;
  bool bVar5;
  long *in_RDX;
  char in_R8B;
  
  this->m_gl = (Functions *)ctx;
  switch(in_ECX) {
  case 0:
    in_RAX = (shaderDefinition *)in_RDX[4];
    this->compute_shader = in_RAX;
    break;
  case 1:
    psVar3 = (shaderDefinition *)in_RDX[5];
    this->fragment_shader = psVar3;
    psVar4 = (shaderDefinition *)in_RDX[3];
    goto LAB_00d87daa;
  case 2:
    psVar3 = (shaderDefinition *)*in_RDX;
    this->fragment_shader = psVar3;
    psVar4 = (shaderDefinition *)in_RDX[6];
    this->geometry_shader = psVar4;
    in_RAX = (shaderDefinition *)in_RDX[3];
    this->vertex_shader = in_RAX;
    if (psVar4 == (shaderDefinition *)0x0 || psVar3 == (shaderDefinition *)0x0)
    goto switchD_00d87cdf_default;
    break;
  case 3:
    psVar3 = (shaderDefinition *)*in_RDX;
    this->fragment_shader = psVar3;
    psVar1 = (shaderDefinition *)in_RDX[7];
    this->tesselation_control_shader = psVar1;
    psVar4 = (shaderDefinition *)in_RDX[2];
    this->tesselation_evaluation_shader = psVar4;
    in_RAX = (shaderDefinition *)in_RDX[3];
    this->vertex_shader = in_RAX;
    bVar5 = psVar1 == (shaderDefinition *)0x0 || psVar3 == (shaderDefinition *)0x0;
    goto LAB_00d87d82;
  case 4:
    psVar3 = (shaderDefinition *)*in_RDX;
    this->fragment_shader = psVar3;
    if (in_R8B != '\0') {
      this->tesselation_control_shader = (shaderDefinition *)in_RDX[1];
    }
    psVar4 = (shaderDefinition *)in_RDX[8];
    this->tesselation_evaluation_shader = psVar4;
    in_RAX = (shaderDefinition *)in_RDX[3];
    this->vertex_shader = in_RAX;
    bVar5 = this->tesselation_control_shader == (shaderDefinition *)0x0 ||
            psVar3 == (shaderDefinition *)0x0;
LAB_00d87d82:
    if (psVar4 == (shaderDefinition *)0x0 || bVar5) goto switchD_00d87cdf_default;
    break;
  case 5:
    psVar3 = (shaderDefinition *)*in_RDX;
    this->fragment_shader = psVar3;
    psVar4 = (shaderDefinition *)in_RDX[9];
LAB_00d87daa:
    this->vertex_shader = psVar4;
    in_RAX = (shaderDefinition *)
             CONCAT71((int7)((ulong)psVar3 >> 8),
                      psVar4 != (shaderDefinition *)0x0 && psVar3 != (shaderDefinition *)0x0);
    goto LAB_00d87dbc;
  default:
    goto switchD_00d87cdf_default;
  }
  in_RAX = (shaderDefinition *)
           CONCAT71((int7)((ulong)in_RAX >> 8),in_RAX != (shaderDefinition *)0x0);
LAB_00d87dbc:
  if ((char)in_RAX != '\0') {
    GVar2 = (**(code **)(ctx + 0x3c8))();
    this->m_program_object_id = GVar2;
    err = (**(code **)(ctx + 0x800))();
    glu::checkError(err,"Failed to create program",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0x1194);
    in_RAX = extraout_RAX;
    if (this->m_program_object_id == 0) {
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_00,"glCreateProgram return invalid id",fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                 ,0x1198);
      __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
  }
switchD_00d87cdf_default:
  return (int)in_RAX;
}

Assistant:

void TextureCubeMapArraySamplingTest::programDefinition::init(const glw::Functions& gl, const shaderGroup& shader_group,
															  shaderType shader_type, bool isContextES)
{
	m_gl = &gl;

	bool is_program_defined = false;

	switch (shader_type)
	{
	case Compute:
		compute_shader	 = shader_group.sampling_compute_shader;
		is_program_defined = (0 != compute_shader);
		break;
	case Fragment:
		fragment_shader	= shader_group.sampling_fragment_shader;
		vertex_shader	  = shader_group.pass_through_vertex_shader;
		is_program_defined = ((0 != fragment_shader) && (0 != vertex_shader));
		break;
	case Geometry:
		fragment_shader	= shader_group.pass_through_fragment_shader;
		geometry_shader	= shader_group.sampling_geometry_shader;
		vertex_shader	  = shader_group.pass_through_vertex_shader;
		is_program_defined = ((0 != fragment_shader) && (0 != geometry_shader) && (0 != vertex_shader));
		break;
	case Tesselation_Control:
		fragment_shader				  = shader_group.pass_through_fragment_shader;
		tesselation_control_shader	= shader_group.sampling_tesselation_control_shader;
		tesselation_evaluation_shader = shader_group.pass_through_tesselation_evaluation_shader;
		vertex_shader				  = shader_group.pass_through_vertex_shader;
		is_program_defined			  = ((0 != fragment_shader) && (0 != tesselation_control_shader) &&
							  (0 != tesselation_evaluation_shader) && (0 != vertex_shader));
		break;
	case Tesselation_Evaluation:
		fragment_shader = shader_group.pass_through_fragment_shader;
		if (isContextES)
		{
			tesselation_control_shader = shader_group.pass_through_tesselation_control_shader;
		}
		tesselation_evaluation_shader = shader_group.sampling_tesselation_evaluation_shader;
		vertex_shader				  = shader_group.pass_through_vertex_shader;
		is_program_defined			  = ((0 != fragment_shader) && (0 != tesselation_control_shader) &&
							  (0 != tesselation_evaluation_shader) && (0 != vertex_shader));
		break;
	case Vertex:
		fragment_shader	= shader_group.pass_through_fragment_shader;
		vertex_shader	  = shader_group.sampling_vertex_shader;
		is_program_defined = ((0 != fragment_shader) && (0 != vertex_shader));
		break;
	}

	if (true == is_program_defined)
	{
		m_program_object_id = m_gl->createProgram();

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create program");

		if (m_invalid_program_object_id == m_program_object_id)
		{
			throw tcu::InternalError("glCreateProgram return invalid id", "", __FILE__, __LINE__);
		}
	}
}